

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O2

uint32_t FAudioCreateWithCustomAllocatorEXT
                   (FAudio **ppFAudio,uint32_t Flags,FAudioProcessor XAudio2Processor,
                   FAudioMallocFunc customMalloc,FAudioFreeFunc customFree,
                   FAudioReallocFunc customRealloc)

{
  FAudioProcessor XAudio2Processor_00;
  uint32_t Flags_00;
  
  Flags_00 = 8;
  FAudioCOMConstructWithCustomAllocatorEXT(ppFAudio,'\b',customMalloc,customFree,customRealloc);
  FAudio_Initialize(*ppFAudio,Flags_00,XAudio2Processor_00);
  return 0;
}

Assistant:

uint32_t FAudioCreateWithCustomAllocatorEXT(
	FAudio **ppFAudio,
	uint32_t Flags,
	FAudioProcessor XAudio2Processor,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc
) {
	FAudioCOMConstructWithCustomAllocatorEXT(
		ppFAudio,
		FAUDIO_TARGET_VERSION,
		customMalloc,
		customFree,
		customRealloc
	);
	FAudio_Initialize(*ppFAudio, Flags, XAudio2Processor);
	return 0;
}